

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20250127::debugging_internal::ParseVendorExtendedType(State *state)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  ParseState copy;
  
  iVar5 = state->recursion_depth;
  iVar1 = state->steps;
  state->recursion_depth = iVar5 + 1;
  state->steps = iVar1 + 1;
  if (0x1ffff < iVar1 || 0xff < iVar5) {
    bVar4 = false;
    goto LAB_0037e8e3;
  }
  iVar5 = (state->parse_state).mangled_idx;
  iVar1 = (state->parse_state).out_cur_idx;
  iVar2 = (state->parse_state).prev_name_idx;
  uVar3 = *(undefined4 *)&(state->parse_state).field_0xc;
  bVar4 = ParseOneCharToken(state,'u');
  if (bVar4) {
    bVar4 = ParseSourceName(state);
    if (!bVar4) goto LAB_0037e8d1;
    bVar4 = true;
    ParseTemplateArgs(state);
  }
  else {
LAB_0037e8d1:
    (state->parse_state).mangled_idx = iVar5;
    (state->parse_state).out_cur_idx = iVar1;
    (state->parse_state).prev_name_idx = iVar2;
    *(undefined4 *)&(state->parse_state).field_0xc = uVar3;
    bVar4 = false;
  }
  iVar5 = state->recursion_depth + -1;
LAB_0037e8e3:
  state->recursion_depth = iVar5;
  return bVar4;
}

Assistant:

static bool ParseVendorExtendedType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'u') && ParseSourceName(state) &&
      Optional(ParseTemplateArgs(state))) {
    return true;
  }
  state->parse_state = copy;
  return false;
}